

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O2

HelicsBool helicsDataBufferConvertToType(HelicsDataBuffer data,int newDataType)

{
  DataType DVar1;
  SmallBuffer *this;
  HelicsBool HVar2;
  defV oVal;
  undefined1 local_80 [16];
  element_type *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_68 [9];
  
  this = getBuffer(data);
  if (this == (SmallBuffer *)0x0) {
    HVar2 = 0;
  }
  else {
    DVar1 = helics::detail::detectType(this->heap);
    HVar2 = 1;
    if (DVar1 != newDataType) {
      oVal.
      super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      .
      super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
      .
      super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
      .
      super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
      .
      super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
      .
      super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
      ._M_u._M_first._M_storage = (_Uninitialized<double,_true>)0.0;
      oVal.
      super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      .
      super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
      .
      super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
      .
      super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
      .
      super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
      .
      super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
      ._M_index = '\0';
      local_80._0_8_ = this->bufferSize;
      local_80._8_8_ = this->heap;
      local_70 = (element_type *)0x0;
      a_Stack_68[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      helics::valueExtract((data_view *)local_80,HELICS_ANY,&oVal);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_68);
      helics::typeConvertDefV((SmallBuffer *)local_80,newDataType,&oVal);
      helics::SmallBuffer::operator=(this,(SmallBuffer *)local_80);
      helics::SmallBuffer::~SmallBuffer((SmallBuffer *)local_80);
      std::__detail::__variant::
      _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                           *)&oVal);
    }
  }
  return HVar2;
}

Assistant:

HelicsBool helicsDataBufferConvertToType(HelicsDataBuffer data, int newDataType)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return HELICS_FALSE;
    }
    auto type = helics::detail::detectType(ptr->data());
    if (static_cast<int>(type) == newDataType) {
        return HELICS_TRUE;
    }
    helics::defV oVal;
    helics::valueExtract(*ptr, helics::DataType::HELICS_ANY, oVal);
    *ptr = helics::typeConvertDefV(static_cast<helics::DataType>(newDataType), oVal);
    return HELICS_TRUE;
}